

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactTuple.h
# Opt level: O3

void __thiscall
chrono::ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
::Reset_cinfo(ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
              *this,ChContactable_3vars<6,_6,_6> *mobjA,ChContactable_3vars<6,_6,_6> *mobjB,
             ChCollisionInfo *cinfo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [64];
  undefined1 auVar6 [64];
  ChVector<double> Vz;
  ChVector<double> Vy;
  ChVector<double> Vx;
  undefined1 local_78 [16];
  double local_68;
  undefined1 local_58 [16];
  double local_48;
  undefined1 local_38 [16];
  double local_28;
  undefined1 auVar5 [64];
  
  if (mobjA == (ChContactable_3vars<6,_6,_6> *)0x0) {
    __assert_fail("mobjA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                  ,0x50,
                  "void chrono::ChContactTuple<chrono::ChContactable_3vars<6, 6, 6>, chrono::ChContactable_3vars<6, 6, 6>>::Reset_cinfo(Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_3vars<6, 6, 6>, Tb = chrono::ChContactable_3vars<6, 6, 6>]"
                 );
  }
  if (mobjB == (ChContactable_3vars<6,_6,_6> *)0x0) {
    __assert_fail("mobjB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactTuple.h"
                  ,0x51,
                  "void chrono::ChContactTuple<chrono::ChContactable_3vars<6, 6, 6>, chrono::ChContactable_3vars<6, 6, 6>>::Reset_cinfo(Ta *, Tb *, const collision::ChCollisionInfo &) [Ta = chrono::ChContactable_3vars<6, 6, 6>, Tb = chrono::ChContactable_3vars<6, 6, 6>]"
                 );
  }
  this->objA = mobjA;
  this->objB = mobjB;
  if ((ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_> *
      )cinfo != this) {
    (this->p1).m_data[0] = (cinfo->vpA).m_data[0];
    (this->p1).m_data[1] = (cinfo->vpA).m_data[1];
    (this->p1).m_data[2] = (cinfo->vpA).m_data[2];
    (this->p2).m_data[0] = (cinfo->vpB).m_data[0];
    (this->p2).m_data[1] = (cinfo->vpB).m_data[1];
    (this->p2).m_data[2] = (cinfo->vpB).m_data[2];
    (this->normal).m_data[0] = (cinfo->vN).m_data[0];
    (this->normal).m_data[1] = (cinfo->vN).m_data[1];
    (this->normal).m_data[2] = (cinfo->vN).m_data[2];
  }
  dVar3 = cinfo->eff_radius;
  this->norm_dist = cinfo->distance;
  this->eff_radius = dVar3;
  local_78 = ZEXT816(0) << 0x20;
  local_28 = 0.0;
  local_48 = 0.0;
  local_68 = 0.0;
  local_58 = local_78;
  local_38 = local_78;
  XdirToDxDyDz<double>
            (&this->normal,(ChVector<double> *)&VECT_Y,(ChVector<double> *)local_38,
             (ChVector<double> *)local_58,(ChVector<double> *)local_78);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_28;
  auVar4 = vbroadcastsd_avx512f(auVar1);
  auVar4 = vpermi2pd_avx512f(_DAT_0095dbc0,ZEXT2464(CONCAT816(auVar4._16_8_,local_38)),
                             ZEXT1664(local_58));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_48;
  auVar5 = vbroadcastsd_avx512f(auVar2);
  auVar6._0_40_ = auVar4._0_40_;
  auVar6._40_8_ = auVar5._40_8_;
  auVar6._48_8_ = auVar4._48_8_;
  auVar6._56_8_ = auVar4._56_8_;
  auVar4 = vpermi2pd_avx512f(_DAT_0095dc00,auVar6,ZEXT1664(local_78));
  *(undefined1 (*) [64])
   (this->contact_plane).super_Matrix<double,_3,_3,_1,_3,_3>.
   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array = auVar4;
  (this->contact_plane).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = local_68;
  return;
}

Assistant:

void Reset_cinfo(Ta* mobjA,                               ///< ChContactable object A
                     Tb* mobjB,                               ///< ChContactable object B
                     const collision::ChCollisionInfo& cinfo  ///< data for the contact pair
    ) {
        assert(mobjA);
        assert(mobjB);

        this->objA = mobjA;
        this->objB = mobjB;

        this->p1 = cinfo.vpA;
        this->p2 = cinfo.vpB;
        this->normal = cinfo.vN;
        this->norm_dist = cinfo.distance;
        this->eff_radius = cinfo.eff_radius;

        // Contact plane
        ChVector<> Vx, Vy, Vz;
        XdirToDxDyDz(normal, VECT_Y, Vx, Vy, Vz);
        contact_plane.Set_A_axis(Vx, Vy, Vz);
    }